

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O1

Saig_MvObj_t * Saig_ManCreateReducedAig(Aig_Man_t *p,Vec_Ptr_t **pvFlops)

{
  int *piVar1;
  ulong uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Saig_MvObj_t *pSVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  Saig_MvObj_t *pSVar10;
  
  iVar8 = p->nRegs;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar8 - 1U) {
    iVar6 = iVar8;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar3->pArray = ppvVar4;
  *pvFlops = pVVar3;
  pVVar3 = p->vObjs;
  iVar8 = pVVar3->nSize;
  pSVar5 = (Saig_MvObj_t *)calloc((long)iVar8 + 1,0xc);
  if (0 < (long)iVar8) {
    lVar9 = 0;
    pSVar10 = pSVar5;
    do {
      piVar1 = (int *)pVVar3->pArray[lVar9];
      if (piVar1 != (int *)0x0) {
        *(uint *)&pSVar10->field_0x8 = *(uint *)&pSVar10->field_0x8 & 0xfffffff8 | piVar1[6] & 7U;
        uVar7 = (uint)*(undefined8 *)(piVar1 + 6) & 7;
        if ((lVar9 == 0) || (uVar7 == 2)) {
          if ((uVar7 == 2) && (p->nTruePis <= *piVar1)) {
            if (*piVar1 < p->nTruePis) {
              __assert_fail("Saig_ObjIsLo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                            ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar7 = (*piVar1 - p->nTruePis) + p->nTruePos;
            if (((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pSVar10->iFan0 = *(int *)((long)p->vCos->pArray[uVar7] + 0x24) * 2;
            pSVar10->iFan1 = -1;
            pVVar3 = *pvFlops;
            uVar7 = pVVar3->nCap;
            if (pVVar3->nSize == uVar7) {
              if ((int)uVar7 < 0x10) {
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
                }
                pVVar3->pArray = ppvVar4;
                iVar8 = 0x10;
              }
              else {
                iVar8 = uVar7 * 2;
                if (iVar8 <= (int)uVar7) goto LAB_006e9d19;
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar7 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar7 << 4);
                }
                pVVar3->pArray = ppvVar4;
              }
              pVVar3->nCap = iVar8;
            }
LAB_006e9d19:
            iVar8 = pVVar3->nSize;
            pVVar3->nSize = iVar8 + 1;
            pVVar3->pArray[iVar8] = pSVar10;
          }
        }
        else {
          uVar2 = *(ulong *)(piVar1 + 2);
          if (uVar2 == 0) {
            uVar7 = 0xfffffffe;
          }
          else {
            uVar7 = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24) * 2;
          }
          pSVar10->iFan0 = (uint)uVar2 & 1 | uVar7;
          if (((uint)*(undefined8 *)(piVar1 + 6) & 7) != 3) {
            if (((uint)*(undefined8 *)(piVar1 + 6) & 7) - 7 < 0xfffffffe) {
              __assert_fail("Aig_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSimMv.c"
                            ,0x9a,
                            "Saig_MvObj_t *Saig_ManCreateReducedAig(Aig_Man_t *, Vec_Ptr_t **)");
            }
            uVar2 = *(ulong *)(piVar1 + 4);
            if (uVar2 == 0) {
              uVar7 = 0xfffffffe;
            }
            else {
              uVar7 = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24) * 2;
            }
            pSVar10->iFan1 = (uint)uVar2 & 1 | uVar7;
          }
        }
      }
      lVar9 = lVar9 + 1;
      pVVar3 = p->vObjs;
      iVar8 = pVVar3->nSize;
      pSVar10 = pSVar10 + 1;
    } while (lVar9 < iVar8);
  }
  pSVar5[iVar8].field_0x8 = pSVar5[iVar8].field_0x8 | 7;
  return pSVar5;
}

Assistant:

Saig_MvObj_t * Saig_ManCreateReducedAig( Aig_Man_t * p, Vec_Ptr_t ** pvFlops )
{
    Saig_MvObj_t * pAig, * pEntry;
    Aig_Obj_t * pObj;
    int i;
    *pvFlops = Vec_PtrAlloc( Aig_ManRegNum(p) );
    pAig = ABC_CALLOC( Saig_MvObj_t, Aig_ManObjNumMax(p)+1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        pEntry = pAig + i;
        pEntry->Type = pObj->Type;
        if ( Aig_ObjIsCi(pObj) || i == 0 )
        {
            if ( Saig_ObjIsLo(p, pObj) )
            {
                pEntry->iFan0 = (Saig_ObjLoToLi(p, pObj)->Id << 1);
                pEntry->iFan1 = -1;
                Vec_PtrPush( *pvFlops, pEntry );
            }
            continue;
        }
        pEntry->iFan0 = (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj);
        if ( Aig_ObjIsCo(pObj) )
            continue;
        assert( Aig_ObjIsNode(pObj) );
        pEntry->iFan1 = (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj);
    }
    pEntry = pAig + Aig_ManObjNumMax(p);
    pEntry->Type = AIG_OBJ_VOID;
    return pAig;
}